

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

void __thiscall
pbrt::anon_struct_8_1_2f67eb89::reportError(anon_struct_8_1_2f67eb89 *this,char *error)

{
  char **in_stack_00000018;
  char *in_stack_00000020;
  
  Error<char_const*&>(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void reportError(const char *error) override { Error("%s", error); }